

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O1

_Bool run_toplevel_callbacks(void)

{
  void **ppvVar1;
  toplevel_callback_fn_t *pp_Var2;
  callback *pcVar3;
  
  pcVar3 = cbhead;
  if (cbhead != (callback *)0x0) {
    cbcurr = cbhead;
    if (cbhead->next == (callback *)0x0) {
      cbtail = (callback *)0x0;
    }
    ppvVar1 = &cbhead->ctx;
    pp_Var2 = &cbhead->fn;
    cbhead = cbhead->next;
    (**pp_Var2)(*ppvVar1);
    safefree(cbcurr);
    cbcurr = (callback *)0x0;
  }
  return pcVar3 != (callback *)0x0;
}

Assistant:

bool run_toplevel_callbacks(void)
{
    bool done_something = false;

    if (cbhead) {
        /*
         * Transfer the head callback into cbcurr to indicate that
         * it's being executed. Then operations which transform the
         * queue, like delete_callbacks_for_context, can proceed as if
         * it's not there.
         */
        cbcurr = cbhead;
        cbhead = cbhead->next;
        if (!cbhead)
            cbtail = NULL;

        /*
         * Now run the callback, and then clear it out of cbcurr.
         */
        cbcurr->fn(cbcurr->ctx);
        sfree(cbcurr);
        cbcurr = NULL;

        done_something = true;
    }
    return done_something;
}